

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_erl_generator.cc
# Opt level: O1

void __thiscall t_erl_generator::init_generator(t_erl_generator *this)

{
  ofstream_with_content_based_conditional_update *this_00;
  ofstream_with_content_based_conditional_update *this_01;
  _func_int **pp_Var1;
  pointer pcVar2;
  int iVar3;
  int *piVar4;
  long *plVar5;
  ostream *poVar6;
  undefined8 *puVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  char *__rhs;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  size_type *psVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  _Rb_tree_node_base *p_Var11;
  _func_int **pp_Var12;
  t_erl_generator *ptVar13;
  _Alloc_hider this_02;
  string f_consts_name;
  string program_module_name;
  string f_consts_hrl_name;
  string f_types_hrl_name;
  string f_types_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string local_150;
  string local_130;
  undefined1 local_110 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  _Rb_tree_node_base *local_f0;
  _Base_ptr local_e8;
  _Rb_tree_node_base local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  _Alloc_hider local_b0;
  size_type local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  _Alloc_hider local_90;
  size_type local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  string local_70;
  string local_50;
  
  (*(this->super_t_generator)._vptr_t_generator[0x1b])(&local_130,this);
  iVar3 = mkdir(local_130._M_dataplus._M_p,0x1ff);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p);
  }
  if (iVar3 == -1) {
    piVar4 = __errno_location();
    if (*piVar4 != 0x11) {
      __return_storage_ptr__ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           __cxa_allocate_exception(0x20);
      (*(this->super_t_generator)._vptr_t_generator[0x1b])(&local_e0._M_left,this);
      std::__cxx11::string::string
                ((string *)&local_90,(char *)local_e0._M_left,(allocator *)&local_150);
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_90);
      local_130._M_dataplus._M_p = (pointer)*plVar5;
      psVar9 = (size_type *)(plVar5 + 2);
      if ((size_type *)local_130._M_dataplus._M_p == psVar9) {
        local_130.field_2._M_allocated_capacity = *psVar9;
        local_130.field_2._8_8_ = plVar5[3];
        local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
      }
      else {
        local_130.field_2._M_allocated_capacity = *psVar9;
      }
      local_130._M_string_length = plVar5[1];
      *plVar5 = (long)psVar9;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      __rhs = strerror(*piVar4);
      std::operator+(__return_storage_ptr__,&local_130,__rhs);
      __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,
                  std::__cxx11::string::~string);
    }
  }
  this->export_lines_first_ = true;
  this->export_types_lines_first_ = true;
  pcVar2 = (this->super_t_generator).program_name_._M_dataplus._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar2,
             pcVar2 + (this->super_t_generator).program_name_._M_string_length);
  make_safe_for_module_name(&local_130,this,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  (*(this->super_t_generator)._vptr_t_generator[0x1b])(&local_150,this);
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_150,(ulong)local_130._M_dataplus._M_p);
  paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 == paVar8) {
    local_c0._M_allocated_capacity = paVar8->_M_allocated_capacity;
    local_c0._8_8_ = plVar5[3];
    local_e0._M_left = (_Base_ptr)&local_c0;
  }
  else {
    local_c0._M_allocated_capacity = paVar8->_M_allocated_capacity;
    local_e0._M_left = (_Base_ptr)*plVar5;
  }
  local_e0._M_right = (_Base_ptr)plVar5[1];
  *plVar5 = (long)paVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_e0._M_left);
  local_90._M_p = (pointer)&local_80;
  paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 == paVar8) {
    local_80._M_allocated_capacity = paVar8->_M_allocated_capacity;
    local_80._8_8_ = plVar5[3];
  }
  else {
    local_80._M_allocated_capacity = paVar8->_M_allocated_capacity;
    local_90._M_p = (pointer)*plVar5;
  }
  local_88 = plVar5[1];
  *plVar5 = (long)paVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_left != &local_c0) {
    operator_delete(local_e0._M_left);
  }
  paVar8 = &local_150.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != paVar8) {
    operator_delete(local_150._M_dataplus._M_p);
  }
  (*(this->super_t_generator)._vptr_t_generator[0x1b])(&local_f0,this);
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_f0,(ulong)local_130._M_dataplus._M_p);
  psVar9 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_150.field_2._M_allocated_capacity = *psVar9;
    local_150.field_2._8_8_ = plVar5[3];
    local_150._M_dataplus._M_p = (pointer)paVar8;
  }
  else {
    local_150.field_2._M_allocated_capacity = *psVar9;
    local_150._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_150._M_string_length = plVar5[1];
  *plVar5 = (long)psVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_150);
  paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 == paVar10) {
    local_c0._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_c0._8_8_ = plVar5[3];
    local_e0._M_left = (_Base_ptr)&local_c0;
  }
  else {
    local_c0._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_e0._M_left = (_Base_ptr)*plVar5;
  }
  local_e0._M_right = (_Base_ptr)plVar5[1];
  *plVar5 = (long)paVar10;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != paVar8) {
    operator_delete(local_150._M_dataplus._M_p);
  }
  if (local_f0 != &local_e0) {
    operator_delete(local_f0);
  }
  std::__cxx11::string::string((string *)&local_150,local_90._M_p,(allocator *)&local_f0);
  std::__cxx11::string::_M_assign
            ((string *)
             &(this->f_types_file_).super_ostringstream.
              super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
  this_00 = &this->f_types_file_;
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::clear_buf
            (this_00);
  (this->f_types_file_).super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.
  field_0x90 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != paVar8) {
    operator_delete(local_150._M_dataplus._M_p);
  }
  std::__cxx11::string::string((string *)&local_150,(char *)local_e0._M_left,(allocator *)&local_f0)
  ;
  std::__cxx11::string::_M_assign
            ((string *)
             &(this->f_types_hrl_file_).super_ostringstream.
              super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
  this_01 = &this->f_types_hrl_file_;
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::clear_buf
            (this_01);
  (this->f_types_hrl_file_).super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.
  field_0x90 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != paVar8) {
    operator_delete(local_150._M_dataplus._M_p);
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,local_130._M_dataplus._M_p,
             local_130._M_dataplus._M_p + local_130._M_string_length);
  std::__cxx11::string::append((char *)&local_70);
  ptVar13 = (t_erl_generator *)this_01;
  hrl_header(this,(ostream *)this_01,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  erl_autogen_comment_abi_cxx11_(&local_150,ptVar13);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)this_00,local_150._M_dataplus._M_p,local_150._M_string_length);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"-module(",8);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,local_130._M_dataplus._M_p,local_130._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"_types).",8);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  local_e8 = (_Base_ptr)0x0;
  local_e0._0_8_ = local_e0._0_8_ & 0xffffffffffffff00;
  local_f0 = &local_e0;
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)&local_e0,0);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if (local_f0 != &local_e0) {
    operator_delete(local_f0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != paVar8) {
    operator_delete(local_150._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"-include(\"",10);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)this_00,local_130._M_dataplus._M_p,local_130._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"_types.hrl\").",0xd);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  render_includes_abi_cxx11_(&local_150,this);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)this_01,local_150._M_dataplus._M_p,local_150._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != paVar8) {
    operator_delete(local_150._M_dataplus._M_p);
  }
  (*(this->super_t_generator)._vptr_t_generator[0x1b])(local_110,this);
  puVar7 = (undefined8 *)
           std::__cxx11::string::_M_append(local_110,(ulong)local_130._M_dataplus._M_p);
  p_Var11 = (_Rb_tree_node_base *)(puVar7 + 2);
  if ((_Rb_tree_node_base *)*puVar7 == p_Var11) {
    local_e0._0_8_ = *(undefined8 *)p_Var11;
    local_e0._M_parent = (_Base_ptr)puVar7[3];
    local_f0 = &local_e0;
  }
  else {
    local_e0._0_8_ = *(undefined8 *)p_Var11;
    local_f0 = (_Rb_tree_node_base *)*puVar7;
  }
  local_e8 = (_Base_ptr)puVar7[1];
  *puVar7 = p_Var11;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_f0);
  psVar9 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_150.field_2._M_allocated_capacity = *psVar9;
    local_150.field_2._8_8_ = plVar5[3];
    local_150._M_dataplus._M_p = (pointer)paVar8;
  }
  else {
    local_150.field_2._M_allocated_capacity = *psVar9;
    local_150._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_150._M_string_length = plVar5[1];
  *plVar5 = (long)psVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if (local_f0 != &local_e0) {
    operator_delete(local_f0);
  }
  pp_Var1 = (_func_int **)(local_110 + 0x10);
  if ((_func_int **)local_110._0_8_ != pp_Var1) {
    operator_delete((void *)local_110._0_8_);
  }
  (*(this->super_t_generator)._vptr_t_generator[0x1b])(&local_b0,this);
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_b0,(ulong)local_130._M_dataplus._M_p);
  pp_Var12 = (_func_int **)(plVar5 + 2);
  if ((_func_int **)*plVar5 == pp_Var12) {
    local_100._M_allocated_capacity = (size_type)*pp_Var12;
    local_100._8_8_ = plVar5[3];
    local_110._0_8_ = pp_Var1;
  }
  else {
    local_100._M_allocated_capacity = (size_type)*pp_Var12;
    local_110._0_8_ = (_func_int **)*plVar5;
  }
  local_110._8_8_ = plVar5[1];
  *plVar5 = (long)pp_Var12;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  puVar7 = (undefined8 *)std::__cxx11::string::append(local_110);
  p_Var11 = (_Rb_tree_node_base *)(puVar7 + 2);
  if ((_Rb_tree_node_base *)*puVar7 == p_Var11) {
    local_e0._0_8_ = *(undefined8 *)p_Var11;
    local_e0._M_parent = (_Base_ptr)puVar7[3];
    local_f0 = &local_e0;
  }
  else {
    local_e0._0_8_ = *(undefined8 *)p_Var11;
    local_f0 = (_Rb_tree_node_base *)*puVar7;
  }
  local_e8 = (_Base_ptr)puVar7[1];
  *puVar7 = p_Var11;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  if ((_func_int **)local_110._0_8_ != pp_Var1) {
    operator_delete((void *)local_110._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_p != &local_a0) {
    operator_delete(local_b0._M_p);
  }
  std::__cxx11::string::string
            ((string *)local_110,local_150._M_dataplus._M_p,(allocator *)&local_b0);
  std::__cxx11::string::_M_assign
            ((string *)
             &(this->f_consts_file_).super_ostringstream.
              super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::clear_buf
            (&this->f_consts_file_);
  (this->f_consts_file_).super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.
  field_0x90 = 0;
  if ((_func_int **)local_110._0_8_ != pp_Var1) {
    operator_delete((void *)local_110._0_8_);
  }
  std::__cxx11::string::string((string *)local_110,(char *)local_f0,(allocator *)&local_b0);
  ptVar13 = (t_erl_generator *)local_110;
  std::__cxx11::string::_M_assign
            ((string *)
             &(this->f_consts_hrl_file_).super_ostringstream.
              super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::clear_buf
            (&this->f_consts_hrl_file_);
  (this->f_consts_hrl_file_).super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.
  field_0x90 = 0;
  if ((_func_int **)local_110._0_8_ != pp_Var1) {
    operator_delete((void *)local_110._0_8_);
  }
  erl_autogen_comment_abi_cxx11_((string *)local_110,ptVar13);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&this->f_consts_file_,(char *)local_110._0_8_,local_110._8_8_);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"-module(",8);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,local_130._M_dataplus._M_p,local_130._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"_constants).",0xc);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  local_a8 = 0;
  local_a0._M_local_buf[0] = '\0';
  local_b0._M_p = (pointer)&local_a0;
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_a0._M_local_buf,0);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"-include(\"",10);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,local_130._M_dataplus._M_p,local_130._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"_types.hrl\").",0xd);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  this_02 = ::endl_abi_cxx11_._M_dataplus;
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_p != &local_a0) {
    operator_delete(local_b0._M_p);
  }
  if ((_func_int **)local_110._0_8_ != pp_Var1) {
    operator_delete((void *)local_110._0_8_);
  }
  erl_autogen_comment_abi_cxx11_((string *)local_110,(t_erl_generator *)this_02._M_p);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&this->f_consts_hrl_file_,(char *)local_110._0_8_,local_110._8_8_);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  local_a8 = 0;
  local_a0._M_local_buf[0] = '\0';
  local_b0._M_p = (pointer)&local_a0;
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_a0._M_local_buf,0);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"-include(\"",10);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,local_130._M_dataplus._M_p,local_130._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"_types.hrl\").",0xd);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_p != &local_a0) {
    operator_delete(local_b0._M_p);
  }
  if ((_func_int **)local_110._0_8_ != pp_Var1) {
    operator_delete((void *)local_110._0_8_);
  }
  if (local_f0 != &local_e0) {
    operator_delete(local_f0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_left != &local_c0) {
    operator_delete(local_e0._M_left);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_p != &local_80) {
    operator_delete(local_90._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p);
  }
  return;
}

Assistant:

void t_erl_generator::init_generator() {
  // Make output directory
  MKDIR(get_out_dir().c_str());

  // setup export lines
  export_lines_first_ = true;
  export_types_lines_first_ = true;

  string program_module_name = make_safe_for_module_name(program_name_);

  // types files
  string f_types_name = get_out_dir() + program_module_name + "_types.erl";
  string f_types_hrl_name = get_out_dir() + program_module_name + "_types.hrl";

  f_types_file_.open(f_types_name.c_str());
  f_types_hrl_file_.open(f_types_hrl_name.c_str());

  hrl_header(f_types_hrl_file_, program_module_name + "_types");

  f_types_file_ << erl_autogen_comment() << endl
                << "-module(" << program_module_name << "_types)." << endl
                << erl_imports() << endl;

  f_types_file_ << "-include(\"" << program_module_name << "_types.hrl\")." << endl
                  << endl;

  f_types_hrl_file_ << render_includes() << endl;

  // consts files
  string f_consts_name = get_out_dir() + program_module_name + "_constants.erl";
  string f_consts_hrl_name = get_out_dir() + program_module_name + "_constants.hrl";

  f_consts_file_.open(f_consts_name.c_str());
  f_consts_hrl_file_.open(f_consts_hrl_name.c_str());

  f_consts_file_ << erl_autogen_comment() << endl
                 << "-module(" << program_module_name << "_constants)." << endl
                 << erl_imports() << endl
                 << "-include(\"" << program_module_name << "_types.hrl\")." << endl
                 << endl;

  f_consts_hrl_file_ << erl_autogen_comment() << endl << erl_imports() << endl
                     << "-include(\"" << program_module_name << "_types.hrl\")." << endl << endl;
}